

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nw_diag_sse41_128_32.c
# Opt level: O0

parasail_result_t *
parasail_nw_rowcol_diag_sse41_128_32
          (char *_s1,int _s1Len,char *_s2,int s2Len,int open,int gap,parasail_matrix_t *matrix)

{
  int iVar1;
  int iVar2;
  int iVar3;
  int *piVar4;
  int *piVar5;
  int *piVar6;
  int *piVar7;
  undefined8 uVar8;
  undefined8 uVar9;
  undefined1 auVar10 [16];
  undefined1 auVar11 [16];
  undefined1 auVar12 [16];
  undefined1 auVar13 [16];
  undefined1 auVar14 [16];
  undefined1 auVar15 [16];
  undefined1 auVar16 [16];
  undefined1 auVar17 [16];
  undefined1 auVar18 [16];
  undefined1 auVar19 [16];
  undefined1 auVar20 [16];
  int iVar21;
  int32_t *ptr;
  int32_t *ptr_00;
  int32_t *ptr_01;
  int iVar22;
  uint uVar23;
  uint uVar24;
  uint uVar25;
  uint uVar26;
  uint uVar27;
  uint uVar28;
  int iVar30;
  uint uVar31;
  uint uVar32;
  ulong uVar29;
  int iVar33;
  int iVar34;
  int iVar35;
  int iVar36;
  __m128i vWH_00;
  int32_t in_stack_fffffffffffff6f8;
  int in_stack_fffffffffffff700;
  int local_8fc;
  int local_8e8;
  int local_8e4;
  int local_8d0;
  int local_8cc;
  int local_8b8;
  int local_8b4;
  int local_8a4;
  int local_8a0;
  int32_t value;
  __m128i cond_all;
  __m128i cond_valid_J;
  __m128i cond_valid_I;
  __m128i cond;
  __m128i vNWH;
  __m128i vMat;
  int *matrow3;
  int *matrow2;
  int *matrow1;
  int *matrow0;
  __m128i vJ;
  __m128i vF;
  __m128i vE;
  __m128i vWH;
  __m128i vNH;
  __m128i vIBoundary;
  __m128i vJLimit1;
  __m128i vJLimit;
  __m128i vILimit1;
  __m128i vILimit;
  __m128i vMax;
  __m128i vJreset;
  __m128i vI;
  __m128i vNegOne;
  __m128i vGapN;
  __m128i vN;
  __m128i vOne;
  __m128i vGap;
  __m128i vOpen;
  __m128i vNegInf;
  __m128i vSaturationCheckMax;
  __m128i vSaturationCheckMin;
  __m128i vPosLimit;
  __m128i vNegLimit;
  int local_68c;
  int32_t score;
  int32_t POS_LIMIT;
  int32_t NEG_LIMIT;
  int32_t end_ref;
  int32_t end_query;
  int32_t j;
  int32_t i;
  parasail_result_t *result;
  int32_t *F_pr;
  int32_t *H_pr;
  int32_t *s2;
  int32_t *_F_pr;
  int32_t *_H_pr;
  int32_t *s2B;
  int32_t *s1;
  int32_t s2Len_PAD;
  int32_t s1Len_PAD;
  int32_t s1Len;
  int32_t PAD2;
  int32_t PAD;
  int32_t N;
  int gap_local;
  int open_local;
  int s2Len_local;
  char *_s2_local;
  int _s1Len_local;
  char *_s1_local;
  int local_3c8;
  int iStack_3c4;
  int iStack_3c0;
  int iStack_3bc;
  int local_3a8;
  int iStack_3a4;
  int iStack_3a0;
  int iStack_39c;
  int local_388;
  int local_368;
  int iStack_364;
  int iStack_360;
  int local_348;
  int iStack_344;
  int iStack_340;
  int local_2e8;
  int iStack_2e4;
  int iStack_2e0;
  int iStack_2dc;
  int local_208;
  int iStack_204;
  int iStack_200;
  int iStack_1fc;
  int local_1c8;
  int iStack_1c4;
  int iStack_1c0;
  int iStack_1bc;
  int local_1a8;
  int iStack_1a4;
  int iStack_1a0;
  int iStack_19c;
  int iStack_d4;
  int iStack_d0;
  int iStack_cc;
  int local_c8;
  int iStack_c4;
  int iStack_c0;
  int iStack_bc;
  int local_48;
  int iStack_44;
  int iStack_40;
  int iStack_3c;
  int local_18;
  int iStack_14;
  int iStack_10;
  int iStack_c;
  
  s2B = (int32_t *)0x0;
  if (_s2 == (char *)0x0) {
    fprintf(_stderr,"%s: missing %s\n","parasail_nw_rowcol_diag_sse41_128_32","_s2");
    _s1_local = (char *)0x0;
  }
  else if (s2Len < 1) {
    fprintf(_stderr,"%s: %s must be > 0\n","parasail_nw_rowcol_diag_sse41_128_32","s2Len");
    _s1_local = (char *)0x0;
  }
  else if (open < 0) {
    fprintf(_stderr,"%s: %s must be >= 0\n","parasail_nw_rowcol_diag_sse41_128_32","open");
    _s1_local = (char *)0x0;
  }
  else if (gap < 0) {
    fprintf(_stderr,"%s: %s must be >= 0\n","parasail_nw_rowcol_diag_sse41_128_32","gap");
    _s1_local = (char *)0x0;
  }
  else if (matrix == (parasail_matrix_t *)0x0) {
    fprintf(_stderr,"%s: missing %s\n","parasail_nw_rowcol_diag_sse41_128_32","matrix");
    _s1_local = (char *)0x0;
  }
  else {
    if (matrix->type == 0) {
      if (_s1 == (char *)0x0) {
        fprintf(_stderr,"%s: missing %s\n","parasail_nw_rowcol_diag_sse41_128_32","_s1");
        return (parasail_result_t *)0x0;
      }
      if (_s1Len < 1) {
        fprintf(_stderr,"%s: %s must be > 0\n","parasail_nw_rowcol_diag_sse41_128_32","_s1Len");
        return (parasail_result_t *)0x0;
      }
    }
    local_8a0 = _s1Len;
    if (matrix->type != 0) {
      local_8a0 = matrix->length;
    }
    NEG_LIMIT = local_8a0 + -1;
    POS_LIMIT = s2Len + -1;
    if (-open < matrix->min) {
      local_8a4 = open + -0x80000000;
    }
    else {
      local_8a4 = -0x80000000 - matrix->min;
    }
    local_8a4 = local_8a4 + 1;
    iVar21 = 0x7ffffffe - matrix->max;
    vNegInf[1] = CONCAT44(local_8a4,local_8a4);
    vSaturationCheckMax[0] = CONCAT44(local_8a4,local_8a4);
    vSaturationCheckMax[1] = CONCAT44(iVar21,iVar21);
    vSaturationCheckMin[0] = CONCAT44(iVar21,iVar21);
    uVar8 = CONCAT44(local_8a4,local_8a4);
    uVar9 = CONCAT44(local_8a4,local_8a4);
    vJreset[1] = 0x200000003;
    vI[0] = 1;
    vMax[0] = uVar9;
    vILimit[1] = uVar8;
    iVar22 = -open;
    vNH[1] = CONCAT44(iVar22 + gap * -2,iVar22 + gap * -3);
    vIBoundary[0] = CONCAT44(iVar22,iVar22 - gap);
    _s1_local = (char *)parasail_result_new_rowcol1(local_8a0,s2Len);
    if ((parasail_result_t *)_s1_local == (parasail_result_t *)0x0) {
      _s1_local = (char *)0x0;
    }
    else {
      ((parasail_result_t *)_s1_local)->flag = ((parasail_result_t *)_s1_local)->flag | 0x4401001;
      ((parasail_result_t *)_s1_local)->flag = ((parasail_result_t *)_s1_local)->flag | 0x40000;
      ptr = parasail_memalign_int32_t(0x10,(long)(s2Len + 6));
      ptr_00 = parasail_memalign_int32_t(0x10,(long)(s2Len + 6));
      ptr_01 = parasail_memalign_int32_t(0x10,(long)(s2Len + 6));
      if (ptr == (int32_t *)0x0) {
        _s1_local = (char *)0x0;
      }
      else if (ptr_00 == (int32_t *)0x0) {
        _s1_local = (char *)0x0;
      }
      else if (ptr_01 == (int32_t *)0x0) {
        _s1_local = (char *)0x0;
      }
      else {
        if (matrix->type == 0) {
          s2B = parasail_memalign_int32_t(0x10,(long)(local_8a0 + 3));
          if (s2B == (int32_t *)0x0) {
            return (parasail_result_t *)0x0;
          }
          for (end_query = 0; end_query < local_8a0; end_query = end_query + 1) {
            s2B[end_query] = matrix->mapper[(byte)_s1[end_query]];
          }
          for (end_query = local_8a0; end_query < local_8a0 + 3; end_query = end_query + 1) {
            s2B[end_query] = 0;
          }
        }
        for (end_ref = 0; end_ref < s2Len; end_ref = end_ref + 1) {
          ptr[(long)end_ref + 3] = matrix->mapper[(byte)_s2[end_ref]];
        }
        for (end_ref = -3; iVar22 = s2Len, end_ref < 0; end_ref = end_ref + 1) {
          ptr[(long)end_ref + 3] = 0;
        }
        while (end_ref = iVar22, end_ref < s2Len + 3) {
          ptr[(long)end_ref + 3] = 0;
          iVar22 = end_ref + 1;
        }
        for (end_ref = 0; end_ref < s2Len; end_ref = end_ref + 1) {
          ptr_00[(long)end_ref + 3] = -(end_ref * gap) - open;
          ptr_01[(long)end_ref + 3] = local_8a4;
        }
        for (end_ref = -3; iVar22 = s2Len, end_ref < 0; end_ref = end_ref + 1) {
          ptr_00[(long)end_ref + 3] = local_8a4;
          ptr_01[(long)end_ref + 3] = local_8a4;
        }
        while (end_ref = iVar22, end_ref < s2Len + 3) {
          ptr_00[(long)end_ref + 3] = local_8a4;
          ptr_01[(long)end_ref + 3] = local_8a4;
          iVar22 = end_ref + 1;
        }
        ptr_00[2] = 0;
        for (end_query = 0; end_query < local_8a0; end_query = end_query + 4) {
          vNH[0] = uVar9;
          vWH[1] = uVar8;
          vWH[0] = uVar9;
          vE[1] = uVar8;
          vE[0] = uVar9;
          vF[1] = uVar8;
          vF[0] = uVar9;
          vJ[1] = uVar8;
          vJ[0] = 0xffffffff;
          piVar4 = matrix->matrix;
          iVar22 = matrix->size;
          if (matrix->type == 0) {
            local_8b4 = s2B[end_query];
          }
          else {
            if (end_query < local_8a0) {
              local_8b8 = end_query;
            }
            else {
              local_8b8 = local_8a0 + -1;
            }
            local_8b4 = local_8b8;
          }
          piVar5 = matrix->matrix;
          iVar1 = matrix->size;
          if (matrix->type == 0) {
            local_8cc = s2B[end_query + 1];
          }
          else {
            if (end_query + 1 < local_8a0) {
              local_8d0 = end_query + 1;
            }
            else {
              local_8d0 = local_8a0 + -1;
            }
            local_8cc = local_8d0;
          }
          piVar6 = matrix->matrix;
          iVar2 = matrix->size;
          if (matrix->type == 0) {
            local_8e4 = s2B[end_query + 2];
          }
          else {
            if (end_query + 2 < local_8a0) {
              local_8e8 = end_query + 2;
            }
            else {
              local_8e8 = local_8a0 + -1;
            }
            local_8e4 = local_8e8;
          }
          piVar7 = matrix->matrix;
          iVar3 = matrix->size;
          if (matrix->type == 0) {
            local_8fc = s2B[end_query + 3];
          }
          else if (end_query + 3 < local_8a0) {
            in_stack_fffffffffffff700 = end_query + 3;
            local_8fc = in_stack_fffffffffffff700;
          }
          else {
            in_stack_fffffffffffff700 = local_8a0 + -1;
            local_8fc = in_stack_fffffffffffff700;
          }
          stack0xfffffffffffff828 = vWH._12_12_;
          vNH[0]._4_4_ = ptr_00[2];
          vE[1] = vE._12_8_;
          vWH[0]._4_4_ = -(open + end_query * gap);
          vWH[0]._0_4_ = local_8a4;
          ptr_00[2] = -((end_query + 4) * gap) - open;
          end_ref = 0;
          matrow0 = (int *)0xfffffffefffffffd;
          while( true ) {
            auVar11 = stack0xfffffffffffff828;
            local_1c8 = (int)vJreset[1];
            iStack_1c4 = (int)((ulong)vJreset[1] >> 0x20);
            iStack_1c0 = (int)vI[0];
            iStack_1bc = (int)((ulong)vI[0] >> 0x20);
            if (s2Len + 3 <= end_ref) break;
            stack0xfffffffffffff828 = vE._12_12_;
            vNH[0]._4_4_ = ptr_00[(long)end_ref + 3];
            local_348 = vE[1]._4_4_;
            iStack_344 = (int)vE[2];
            iStack_340 = vE[2]._4_4_;
            iVar33 = local_348 - open;
            iVar34 = iStack_344 - open;
            iVar35 = iStack_340 - open;
            iVar36 = ptr_00[(long)end_ref + 3] - open;
            local_368 = vJ[1]._4_4_;
            iStack_364 = (int)vJ[2];
            iStack_360 = vJ[2]._4_4_;
            local_368 = local_368 - gap;
            iStack_364 = iStack_364 - gap;
            iStack_360 = iStack_360 - gap;
            iVar30 = ptr_01[(long)end_ref + 3] - gap;
            uVar23 = (uint)(iVar33 < local_368) * local_368 | (uint)(iVar33 >= local_368) * iVar33;
            uVar25 = (uint)(iVar34 < iStack_364) * iStack_364 |
                     (uint)(iVar34 >= iStack_364) * iVar34;
            uVar27 = (uint)(iVar35 < iStack_360) * iStack_360 |
                     (uint)(iVar35 >= iStack_360) * iVar35;
            uVar31 = (uint)(iVar36 < iVar30) * iVar30 | (uint)(iVar36 >= iVar30) * iVar36;
            vJ[1] = CONCAT44(uVar25,uVar23);
            vF[0]._0_4_ = uVar27;
            vF[0]._4_4_ = uVar31;
            local_388 = (int)vE[1];
            local_388 = local_388 - open;
            local_348 = local_348 - open;
            iStack_344 = iStack_344 - open;
            iStack_340 = iStack_340 - open;
            local_3a8 = (int)vF[1];
            iStack_3a4 = vF[1]._4_4_;
            iStack_3a0 = (int)vF[2];
            iStack_39c = vF[2]._4_4_;
            local_3a8 = local_3a8 - gap;
            iStack_3a4 = iStack_3a4 - gap;
            iStack_3a0 = iStack_3a0 - gap;
            iStack_39c = iStack_39c - gap;
            uVar24 = (uint)(local_388 < local_3a8) * local_3a8 |
                     (uint)(local_388 >= local_3a8) * local_388;
            uVar26 = (uint)(local_348 < iStack_3a4) * iStack_3a4 |
                     (uint)(local_348 >= iStack_3a4) * local_348;
            uVar28 = (uint)(iStack_344 < iStack_3a0) * iStack_3a0 |
                     (uint)(iStack_344 >= iStack_3a0) * iStack_344;
            uVar32 = (uint)(iStack_340 < iStack_39c) * iStack_39c |
                     (uint)(iStack_340 >= iStack_39c) * iStack_340;
            vF[1] = CONCAT44(uVar26,uVar24);
            vE[0]._0_4_ = uVar28;
            vE[0]._4_4_ = uVar32;
            local_208 = auVar11._0_4_;
            iStack_204 = auVar11._4_4_;
            iStack_200 = auVar11._8_4_;
            iStack_1fc = auVar11._12_4_;
            local_208 = local_208 +
                        piVar7[(long)(iVar3 * local_8fc) + (long)ptr[(long)(end_ref + -3) + 3]];
            iStack_204 = iStack_204 +
                         piVar6[(long)(iVar2 * local_8e4) + (long)ptr[(long)(end_ref + -2) + 3]];
            iStack_200 = iStack_200 +
                         piVar5[(long)(iVar1 * local_8cc) + (long)ptr[(long)(end_ref + -1) + 3]];
            iStack_1fc = iStack_1fc +
                         piVar4[(long)(iVar22 * local_8b4) + (long)ptr[(long)end_ref + 3]];
            uVar24 = (local_208 < (int)uVar24) * uVar24 |
                     (uint)(local_208 >= (int)uVar24) * local_208;
            uVar26 = (iStack_204 < (int)uVar26) * uVar26 |
                     (uint)(iStack_204 >= (int)uVar26) * iStack_204;
            uVar28 = (iStack_200 < (int)uVar28) * uVar28 |
                     (uint)(iStack_200 >= (int)uVar28) * iStack_200;
            uVar32 = (iStack_1fc < (int)uVar32) * uVar32 |
                     (uint)(iStack_1fc >= (int)uVar32) * iStack_1fc;
            vE[1] = CONCAT44(((int)uVar26 < (int)uVar25) * uVar25 |
                             ((int)uVar26 >= (int)uVar25) * uVar26,
                             ((int)uVar24 < (int)uVar23) * uVar23 |
                             ((int)uVar24 >= (int)uVar23) * uVar24);
            vWH[0]._0_4_ = ((int)uVar28 < (int)uVar27) * uVar27 |
                           ((int)uVar28 >= (int)uVar27) * uVar28;
            vWH[0]._4_4_ = ((int)uVar32 < (int)uVar31) * uVar31 |
                           ((int)uVar32 >= (int)uVar31) * uVar32;
            local_1a8 = (int)matrow0;
            iStack_1a4 = (int)((ulong)matrow0 >> 0x20);
            iStack_1a0 = (int)vJ[0];
            iStack_19c = (int)((ulong)vJ[0] >> 0x20);
            iVar30 = -(uint)(local_1a8 == -1);
            iVar33 = -(uint)(iStack_1a4 == -1);
            iVar34 = -(uint)(iStack_1a0 == -1);
            iVar35 = -(uint)(iStack_19c == -1);
            auVar17._4_4_ = iVar33;
            auVar17._0_4_ = iVar30;
            auVar17._12_4_ = iVar35;
            auVar17._8_4_ = iVar34;
            auVar19._8_8_ = vWH[0];
            auVar19._0_8_ = vE[1];
            auVar18._8_8_ = vIBoundary[0];
            auVar18._0_8_ = vNH[1];
            register0x00001240 = pblendvb(auVar19,auVar18,auVar17);
            auVar14._4_4_ = iVar33;
            auVar14._0_4_ = iVar30;
            auVar14._12_4_ = iVar35;
            auVar14._8_4_ = iVar34;
            auVar16._8_8_ = vF[0];
            auVar16._0_8_ = vJ[1];
            auVar15._8_8_ = uVar9;
            auVar15._0_8_ = uVar8;
            register0x00001240 = pblendvb(auVar16,auVar15,auVar14);
            auVar11._4_4_ = iVar33;
            auVar11._0_4_ = iVar30;
            auVar11._12_4_ = iVar35;
            auVar11._8_4_ = iVar34;
            auVar13._8_8_ = vE[0];
            auVar13._0_8_ = vF[1];
            auVar12._8_8_ = uVar9;
            auVar12._0_8_ = uVar8;
            register0x00001240 = pblendvb(auVar13,auVar12,auVar11);
            if (3 < end_ref) {
              local_c8 = (int)vSaturationCheckMax[1];
              iStack_c4 = (int)((ulong)vSaturationCheckMax[1] >> 0x20);
              iStack_c0 = (int)vSaturationCheckMin[0];
              iStack_bc = (int)((ulong)vSaturationCheckMin[0] >> 0x20);
              iStack_d4 = vE[1]._4_4_;
              iStack_d0 = (int)vE[2];
              iStack_cc = vE[2]._4_4_;
              vSaturationCheckMax[1] =
                   CONCAT44((uint)(iStack_d4 < iStack_c4) * iStack_d4 |
                            (uint)(iStack_d4 >= iStack_c4) * iStack_c4,
                            (uint)((int)vE[1] < local_c8) * (int)vE[1] |
                            (uint)((int)vE[1] >= local_c8) * local_c8);
              vSaturationCheckMin[0] =
                   CONCAT44((uint)(iStack_cc < iStack_bc) * iStack_cc |
                            (uint)(iStack_cc >= iStack_bc) * iStack_bc,
                            (uint)(iStack_d0 < iStack_c0) * iStack_d0 |
                            (uint)(iStack_d0 >= iStack_c0) * iStack_c0);
              local_2e8 = (int)vNegInf[1];
              iStack_2e4 = (int)((ulong)vNegInf[1] >> 0x20);
              iStack_2e0 = (int)vSaturationCheckMax[0];
              iStack_2dc = (int)((ulong)vSaturationCheckMax[0] >> 0x20);
              vNegInf[1] = CONCAT44((uint)(iStack_2e4 < iStack_d4) * iStack_d4 |
                                    (uint)(iStack_2e4 >= iStack_d4) * iStack_2e4,
                                    (uint)(local_2e8 < (int)vE[1]) * (int)vE[1] |
                                    (uint)(local_2e8 >= (int)vE[1]) * local_2e8);
              vSaturationCheckMax[0] =
                   CONCAT44((uint)(iStack_2dc < iStack_cc) * iStack_cc |
                            (uint)(iStack_2dc >= iStack_cc) * iStack_2dc,
                            (uint)(iStack_2e0 < iStack_d0) * iStack_d0 |
                            (uint)(iStack_2e0 >= iStack_d0) * iStack_2e0);
            }
            vWH_00[0] = (ulong)(uint)end_query;
            vWH_00[1]._0_4_ = local_8a0;
            vWH_00[1]._4_4_ = 0;
            arr_store_rowcol(((((parasail_result_t *)_s1_local)->field_4).rowcols)->score_row,
                             ((((parasail_result_t *)_s1_local)->field_4).rowcols)->score_col,vWH_00
                             ,end_ref,s2Len,in_stack_fffffffffffff6f8,in_stack_fffffffffffff700);
            ptr_00[(long)(end_ref + -3) + 3] = (int)vE[1];
            ptr_01[(long)(end_ref + -3) + 3] = (int32_t)vJ[1];
            auVar10._8_8_ =
                 CONCAT44(-(uint)(iStack_1bc == local_8a0 + -1),
                          -(uint)(iStack_1c0 == local_8a0 + -1)) &
                 CONCAT44(-(uint)(iStack_19c == s2Len + -1),-(uint)(iStack_1a0 == s2Len + -1));
            auVar10._0_8_ =
                 CONCAT44(-(uint)(iStack_1c4 == local_8a0 + -1),-(uint)(local_1c8 == local_8a0 + -1)
                         ) &
                 CONCAT44(-(uint)(iStack_1a4 == s2Len + -1),-(uint)(local_1a8 == s2Len + -1));
            register0x00001240 = pblendvb(stack0xfffffffffffff888,register0x00001240,auVar10);
            matrow0 = (int *)CONCAT44(iStack_1a4 + 1,local_1a8 + 1);
            vJ[0] = CONCAT44(iStack_19c + 1,iStack_1a0 + 1);
            end_ref = end_ref + 1;
          }
          vJreset[1] = CONCAT44(iStack_1c4 + 4,local_1c8 + 4);
          vI[0] = CONCAT44(iStack_1bc + 4,iStack_1c0 + 4);
          local_3c8 = (int)vNH[1];
          iStack_3c4 = (int)((ulong)vNH[1] >> 0x20);
          iStack_3c0 = (int)vIBoundary[0];
          iStack_3bc = (int)((ulong)vIBoundary[0] >> 0x20);
          vNH[1] = CONCAT44(iStack_3c4 + gap * -4,local_3c8 + gap * -4);
          vIBoundary[0] = CONCAT44(iStack_3bc + gap * -4,iStack_3c0 + gap * -4);
        }
        local_68c = local_8a4;
        for (end_query = 0; end_query < 4; end_query = end_query + 1) {
          if (local_68c < vMax[0]._4_4_) {
            local_68c = vMax[0]._4_4_;
          }
          vMax[0] = vMax[0] << 0x20 | (ulong)vILimit[1] >> 0x20;
          vILimit[1] = vILimit[1] << 0x20;
        }
        local_48 = (int)vSaturationCheckMax[1];
        iStack_44 = (int)((ulong)vSaturationCheckMax[1] >> 0x20);
        iStack_40 = (int)vSaturationCheckMin[0];
        iStack_3c = (int)((ulong)vSaturationCheckMin[0] >> 0x20);
        local_18 = (int)vNegInf[1];
        iStack_14 = (int)((ulong)vNegInf[1] >> 0x20);
        iStack_10 = (int)vSaturationCheckMax[0];
        iStack_c = (int)((ulong)vSaturationCheckMax[0] >> 0x20);
        uVar29 = CONCAT44(-(uint)(iStack_3c < local_8a4),-(uint)(iStack_40 < local_8a4)) |
                 CONCAT44(-(uint)(iVar21 < iStack_c),-(uint)(iVar21 < iStack_10));
        auVar20._8_8_ = uVar29;
        auVar20._0_8_ =
             CONCAT44(-(uint)(iStack_44 < local_8a4),-(uint)(local_48 < local_8a4)) |
             CONCAT44(-(uint)(iVar21 < iStack_14),-(uint)(iVar21 < local_18));
        if ((((((((((((((((auVar20 >> 7 & (undefined1  [16])0x1) != (undefined1  [16])0x0 ||
                         (auVar20 >> 0xf & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
                        (auVar20 >> 0x17 & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
                       (auVar20 >> 0x1f & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
                      (auVar20 >> 0x27 & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
                     (auVar20 >> 0x2f & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
                    (auVar20 >> 0x37 & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
                   (auVar20 >> 0x3f & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
                  (uVar29 >> 7 & 1) != 0) || (uVar29 >> 0xf & 1) != 0) || (uVar29 >> 0x17 & 1) != 0)
               || (uVar29 >> 0x1f & 1) != 0) || (uVar29 >> 0x27 & 1) != 0) ||
             (uVar29 >> 0x2f & 1) != 0) || (uVar29 >> 0x37 & 1) != 0) || (long)uVar29 < 0) {
          ((parasail_result_t *)_s1_local)->flag = ((parasail_result_t *)_s1_local)->flag | 0x40;
          local_68c = 0;
          NEG_LIMIT = 0;
          POS_LIMIT = 0;
        }
        ((parasail_result_t *)_s1_local)->score = local_68c;
        ((parasail_result_t *)_s1_local)->end_query = NEG_LIMIT;
        ((parasail_result_t *)_s1_local)->end_ref = POS_LIMIT;
        parasail_free(ptr_01);
        parasail_free(ptr_00);
        parasail_free(ptr);
        if (matrix->type == 0) {
          parasail_free(s2B);
        }
      }
    }
  }
  return (parasail_result_t *)_s1_local;
}

Assistant:

parasail_result_t* FNAME(
        const char * const restrict _s1, const int _s1Len,
        const char * const restrict _s2, const int s2Len,
        const int open, const int gap, const parasail_matrix_t *matrix)
{
    /* declare local variables */
    int32_t N = 0;
    int32_t PAD = 0;
    int32_t PAD2 = 0;
    int32_t s1Len = 0;
    int32_t s1Len_PAD = 0;
    int32_t s2Len_PAD = 0;
    int32_t * restrict s1 = NULL;
    int32_t * restrict s2B = NULL;
    int32_t * restrict _H_pr = NULL;
    int32_t * restrict _F_pr = NULL;
    int32_t * restrict s2 = NULL;
    int32_t * restrict H_pr = NULL;
    int32_t * restrict F_pr = NULL;
    parasail_result_t *result = NULL;
    int32_t i = 0;
    int32_t j = 0;
    int32_t end_query = 0;
    int32_t end_ref = 0;
    int32_t NEG_LIMIT = 0;
    int32_t POS_LIMIT = 0;
    int32_t score = 0;
    __m128i vNegLimit;
    __m128i vPosLimit;
    __m128i vSaturationCheckMin;
    __m128i vSaturationCheckMax;
    __m128i vNegInf;
    __m128i vOpen;
    __m128i vGap;
    __m128i vOne;
    __m128i vN;
    __m128i vGapN;
    __m128i vNegOne;
    __m128i vI;
    __m128i vJreset;
    __m128i vMax;
    __m128i vILimit;
    __m128i vILimit1;
    __m128i vJLimit;
    __m128i vJLimit1;
    __m128i vIBoundary;

    /* validate inputs */
    PARASAIL_CHECK_NULL(_s2);
    PARASAIL_CHECK_GT0(s2Len);
    PARASAIL_CHECK_GE0(open);
    PARASAIL_CHECK_GE0(gap);
    PARASAIL_CHECK_NULL(matrix);
    if (matrix->type == PARASAIL_MATRIX_TYPE_SQUARE) {
        PARASAIL_CHECK_NULL(_s1);
        PARASAIL_CHECK_GT0(_s1Len);
    }

    /* initialize stack variables */
    N = 4; /* number of values in vector */
    PAD = N-1;
    PAD2 = PAD*2;
    s1Len = matrix->type == PARASAIL_MATRIX_TYPE_SQUARE ? _s1Len : matrix->length;
    s1Len_PAD = s1Len+PAD;
    s2Len_PAD = s2Len+PAD;
    i = 0;
    j = 0;
    end_query = s1Len-1;
    end_ref = s2Len-1;
    NEG_LIMIT = (-open < matrix->min ? INT32_MIN + open : INT32_MIN - matrix->min) + 1;
    POS_LIMIT = INT32_MAX - matrix->max - 1;
    score = NEG_LIMIT;
    vNegLimit = _mm_set1_epi32(NEG_LIMIT);
    vPosLimit = _mm_set1_epi32(POS_LIMIT);
    vSaturationCheckMin = vPosLimit;
    vSaturationCheckMax = vNegLimit;
    vNegInf = _mm_set1_epi32(NEG_LIMIT);
    vOpen = _mm_set1_epi32(open);
    vGap  = _mm_set1_epi32(gap);
    vOne = _mm_set1_epi32(1);
    vN = _mm_set1_epi32(N);
    vGapN = _mm_set1_epi32(gap*N);
    vNegOne = _mm_set1_epi32(-1);
    vI = _mm_set_epi32(0,1,2,3);
    vJreset = _mm_set_epi32(0,-1,-2,-3);
    vMax = vNegInf;
    vILimit = _mm_set1_epi32(s1Len);
    vILimit1 = _mm_sub_epi32(vILimit, vOne);
    vJLimit = _mm_set1_epi32(s2Len);
    vJLimit1 = _mm_sub_epi32(vJLimit, vOne);
    vIBoundary = _mm_set_epi32(
            -open-0*gap,
            -open-1*gap,
            -open-2*gap,
            -open-3*gap);

    /* initialize result */
#ifdef PARASAIL_TABLE
    result = parasail_result_new_table1(s1Len, s2Len);
#else
#ifdef PARASAIL_ROWCOL
    result = parasail_result_new_rowcol1(s1Len, s2Len);
#else
    result = parasail_result_new();
#endif
#endif
    if (!result) return NULL;

    /* set known flags */
    result->flag |= PARASAIL_FLAG_NW | PARASAIL_FLAG_DIAG
        | PARASAIL_FLAG_BITS_32 | PARASAIL_FLAG_LANES_4;
#ifdef PARASAIL_TABLE
    result->flag |= PARASAIL_FLAG_TABLE;
#endif
#ifdef PARASAIL_ROWCOL
    result->flag |= PARASAIL_FLAG_ROWCOL;
#endif

    /* initialize heap variables */
    s2B= parasail_memalign_int32_t(16, s2Len+PAD2);
    _H_pr = parasail_memalign_int32_t(16, s2Len+PAD2);
    _F_pr = parasail_memalign_int32_t(16, s2Len+PAD2);
    s2 = s2B+PAD; /* will allow later for negative indices */
    H_pr = _H_pr+PAD;
    F_pr = _F_pr+PAD;

    /* validate heap variables */
    if (!s2B) return NULL;
    if (!_H_pr) return NULL;
    if (!_F_pr) return NULL;

    /* convert _s1 from char to int in range 0-23 */
    if (matrix->type == PARASAIL_MATRIX_TYPE_SQUARE) {
        s1 = parasail_memalign_int32_t(16, s1Len+PAD);
        if (!s1) return NULL;
        for (i=0; i<s1Len; ++i) {
            s1[i] = matrix->mapper[(unsigned char)_s1[i]];
        }
        /* pad back of s1 with dummy values */
        for (i=s1Len; i<s1Len_PAD; ++i) {
            s1[i] = 0; /* point to first matrix row because we don't care */
        }
    }

    /* convert _s2 from char to int in range 0-23 */
    for (j=0; j<s2Len; ++j) {
        s2[j] = matrix->mapper[(unsigned char)_s2[j]];
    }
    /* pad front of s2 with dummy values */
    for (j=-PAD; j<0; ++j) {
        s2[j] = 0; /* point to first matrix row because we don't care */
    }
    /* pad back of s2 with dummy values */
    for (j=s2Len; j<s2Len_PAD; ++j) {
        s2[j] = 0; /* point to first matrix row because we don't care */
    }

    /* set initial values for stored row */
    for (j=0; j<s2Len; ++j) {
        H_pr[j] = -open - j*gap;
        F_pr[j] = NEG_LIMIT;
    }
    /* pad front of stored row values */
    for (j=-PAD; j<0; ++j) {
        H_pr[j] = NEG_LIMIT;
        F_pr[j] = NEG_LIMIT;
    }
    /* pad back of stored row values */
    for (j=s2Len; j<s2Len+PAD; ++j) {
        H_pr[j] = NEG_LIMIT;
        F_pr[j] = NEG_LIMIT;
    }
    H_pr[-1] = 0; /* upper left corner */

    /* iterate over query sequence */
    for (i=0; i<s1Len; i+=N) {
        __m128i vNH = vNegInf;
        __m128i vWH = vNegInf;
        __m128i vE = vNegInf;
        __m128i vF = vNegInf;
        __m128i vJ = vJreset;
        const int * const restrict matrow0 = &matrix->matrix[matrix->size * ((matrix->type == PARASAIL_MATRIX_TYPE_SQUARE) ? s1[i+0] : ((i+0 >= s1Len) ? s1Len-1 : i+0))];
        const int * const restrict matrow1 = &matrix->matrix[matrix->size * ((matrix->type == PARASAIL_MATRIX_TYPE_SQUARE) ? s1[i+1] : ((i+1 >= s1Len) ? s1Len-1 : i+1))];
        const int * const restrict matrow2 = &matrix->matrix[matrix->size * ((matrix->type == PARASAIL_MATRIX_TYPE_SQUARE) ? s1[i+2] : ((i+2 >= s1Len) ? s1Len-1 : i+2))];
        const int * const restrict matrow3 = &matrix->matrix[matrix->size * ((matrix->type == PARASAIL_MATRIX_TYPE_SQUARE) ? s1[i+3] : ((i+3 >= s1Len) ? s1Len-1 : i+3))];
        vNH = _mm_srli_si128(vNH, 4);
        vNH = _mm_insert_epi32(vNH, H_pr[-1], 3);
        vWH = _mm_srli_si128(vWH, 4);
        vWH = _mm_insert_epi32(vWH, -open - i*gap, 3);
        H_pr[-1] = -open - (i+N)*gap;
        /* iterate over database sequence */
        for (j=0; j<s2Len+PAD; ++j) {
            __m128i vMat;
            __m128i vNWH = vNH;
            vNH = _mm_srli_si128(vWH, 4);
            vNH = _mm_insert_epi32(vNH, H_pr[j], 3);
            vF = _mm_srli_si128(vF, 4);
            vF = _mm_insert_epi32(vF, F_pr[j], 3);
            vF = _mm_max_epi32(
                    _mm_sub_epi32(vNH, vOpen),
                    _mm_sub_epi32(vF, vGap));
            vE = _mm_max_epi32(
                    _mm_sub_epi32(vWH, vOpen),
                    _mm_sub_epi32(vE, vGap));
            vMat = _mm_set_epi32(
                    matrow0[s2[j-0]],
                    matrow1[s2[j-1]],
                    matrow2[s2[j-2]],
                    matrow3[s2[j-3]]
                    );
            vNWH = _mm_add_epi32(vNWH, vMat);
            vWH = _mm_max_epi32(vNWH, vE);
            vWH = _mm_max_epi32(vWH, vF);
            /* as minor diagonal vector passes across the j=-1 boundary,
             * assign the appropriate boundary conditions */
            {
                __m128i cond = _mm_cmpeq_epi32(vJ,vNegOne);
                vWH = _mm_blendv_epi8(vWH, vIBoundary, cond);
                vF = _mm_blendv_epi8(vF, vNegInf, cond);
                vE = _mm_blendv_epi8(vE, vNegInf, cond);
            }
            /* cannot start checking sat until after J clears boundary */
            if (j > PAD) {
                vSaturationCheckMin = _mm_min_epi32(vSaturationCheckMin, vWH);
                vSaturationCheckMax = _mm_max_epi32(vSaturationCheckMax, vWH);
            }
#ifdef PARASAIL_TABLE
            arr_store_si128(result->tables->score_table, vWH, i, s1Len, j, s2Len);
#endif
#ifdef PARASAIL_ROWCOL
            arr_store_rowcol(result->rowcols->score_row, result->rowcols->score_col, vWH, i, s1Len, j, s2Len);
#endif
            H_pr[j-3] = (int32_t)_mm_extract_epi32(vWH,0);
            F_pr[j-3] = (int32_t)_mm_extract_epi32(vF,0);
            /* as minor diagonal vector passes across table, extract
               last table value at the i,j bound */
            {
                __m128i cond_valid_I = _mm_cmpeq_epi32(vI, vILimit1);
                __m128i cond_valid_J = _mm_cmpeq_epi32(vJ, vJLimit1);
                __m128i cond_all = _mm_and_si128(cond_valid_I, cond_valid_J);
                vMax = _mm_blendv_epi8(vMax, vWH, cond_all);
            }
            vJ = _mm_add_epi32(vJ, vOne);
        }
        vI = _mm_add_epi32(vI, vN);
        vIBoundary = _mm_sub_epi32(vIBoundary, vGapN);
    }

    /* max in vMax */
    for (i=0; i<N; ++i) {
        int32_t value;
        value = (int32_t) _mm_extract_epi32(vMax, 3);
        if (value > score) {
            score = value;
        }
        vMax = _mm_slli_si128(vMax, 4);
    }

    if (_mm_movemask_epi8(_mm_or_si128(
            _mm_cmplt_epi32(vSaturationCheckMin, vNegLimit),
            _mm_cmpgt_epi32(vSaturationCheckMax, vPosLimit)))) {
        result->flag |= PARASAIL_FLAG_SATURATED;
        score = 0;
        end_query = 0;
        end_ref = 0;
    }

    result->score = score;
    result->end_query = end_query;
    result->end_ref = end_ref;

    parasail_free(_F_pr);
    parasail_free(_H_pr);
    parasail_free(s2B);
    if (matrix->type == PARASAIL_MATRIX_TYPE_SQUARE) {
        parasail_free(s1);
    }

    return result;
}